

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ab9709::BacktraceData::Add
          (BacktraceData *this,cmListFileBacktrace *bt,ArrayIndex *index)

{
  bool bVar1;
  ArrayIndex AVar2;
  pointer ppVar3;
  Value *pVVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  Value local_130;
  cmListFileBacktrace local_108;
  UInt local_f4;
  undefined1 local_f0 [4];
  ArrayIndex parent;
  Value local_c8;
  Value local_90;
  undefined1 local_68 [8];
  Value entry;
  _Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false> local_38;
  iterator found;
  cmListFileContext *top;
  ArrayIndex *index_local;
  cmListFileBacktrace *bt_local;
  BacktraceData *this_local;
  
  bVar1 = cmListFileBacktrace::Empty(bt);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    found.super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>)
             cmListFileBacktrace::Top(bt);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
         ::find(&this->NodeMap,(key_type *)&found);
    entry.limit_ = (ptrdiff_t)
                   std::
                   unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
                   ::end(&this->NodeMap);
    bVar1 = std::__detail::operator!=
                      (&local_38,
                       (_Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                        *)&entry.limit_);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false,_false>
                             *)&local_38);
      *index = ppVar3->second;
      this_local._7_1_ = true;
    }
    else {
      Json::Value::Value((Value *)local_68,objectValue);
      AVar2 = AddFile(this,(string *)
                           ((long)found.
                                  super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                                  ._M_cur + 0x20));
      Json::Value::Value(&local_90,AVar2);
      pVVar4 = Json::Value::operator[]((Value *)local_68,"file");
      Json::Value::operator=(pVVar4,&local_90);
      Json::Value::~Value(&local_90);
      if (*(long *)((long)found.
                          super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                          ._M_cur + 0x40) != 0) {
        Json::Value::Value(&local_c8,
                           *(Int *)((long)found.
                                          super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                                          ._M_cur + 0x40));
        pVVar4 = Json::Value::operator[]((Value *)local_68,"line");
        Json::Value::operator=(pVVar4,&local_c8);
        Json::Value::~Value(&local_c8);
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        AVar2 = AddCommand(this,(string *)
                                found.
                                super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                                ._M_cur);
        Json::Value::Value((Value *)local_f0,AVar2);
        pVVar4 = Json::Value::operator[]((Value *)local_68,"command");
        Json::Value::operator=(pVVar4,(Value *)local_f0);
        Json::Value::~Value((Value *)local_f0);
      }
      cmListFileBacktrace::Pop(&local_108);
      bVar1 = Add(this,&local_108,&local_f4);
      cmListFileBacktrace::~cmListFileBacktrace(&local_108);
      if (bVar1) {
        Json::Value::Value(&local_130,local_f4);
        pVVar4 = Json::Value::operator[]((Value *)local_68,"parent");
        Json::Value::operator=(pVVar4,&local_130);
        Json::Value::~Value(&local_130);
      }
      AVar2 = Json::Value::size(&this->Nodes);
      pmVar6 = std::
               unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
               ::operator[](&this->NodeMap,(key_type *)&found);
      *pmVar6 = AVar2;
      *index = AVar2;
      Json::Value::append(&this->Nodes,(Value *)local_68);
      this_local._7_1_ = true;
      Json::Value::~Value((Value *)local_68);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BacktraceData::Add(cmListFileBacktrace const& bt, Json::ArrayIndex& index)
{
  if (bt.Empty()) {
    return false;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index = found->second;
    return true;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  Json::ArrayIndex parent;
  if (this->Add(bt.Pop(), parent)) {
    entry["parent"] = parent;
  }
  index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return true;
}